

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.h
# Opt level: O0

void __thiscall absl::lts_20250127::Span<char>::remove_prefix(Span<char> *this,size_type n)

{
  size_type sVar1;
  anon_class_1_0_00000001 local_19;
  ulong local_18;
  size_type n_local;
  Span<char> *this_local;
  
  local_18 = n;
  n_local = (size_type)this;
  sVar1 = size(this);
  if (sVar1 < local_18) {
    remove_prefix::anon_class_1_0_00000001::operator()(&local_19);
  }
  this->ptr_ = this->ptr_ + local_18;
  this->len_ = this->len_ - local_18;
  return;
}

Assistant:

void remove_prefix(size_type n) noexcept {
    ABSL_HARDENING_ASSERT(size() >= n);
    ptr_ += n;
    len_ -= n;
  }